

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter1.cpp
# Opt level: O0

shared_ptr<UIContext> CreateUIContext(GraphicsContext *gc)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int *in_RSI;
  element_type *in_RDI;
  shared_ptr<UIContext> sVar1;
  char (*unaff_retaddr) [8];
  GraphicsContext *in_stack_00000008;
  shared_ptr<GusteauChapter1UI> ui;
  element_type *this;
  
  this = in_RDI;
  std::make_shared<GusteauChapter1UI,GraphicsContext&,char_const(&)[8],int,int>
            (in_stack_00000008,unaff_retaddr,(int *)in_RDI,in_RSI);
  std::shared_ptr<UIContext>::shared_ptr<GusteauChapter1UI,void>
            ((shared_ptr<UIContext> *)this,(shared_ptr<GusteauChapter1UI> *)in_RDI);
  std::shared_ptr<GusteauChapter1UI>::~shared_ptr((shared_ptr<GusteauChapter1UI> *)0x113a72);
  sVar1.super___shared_ptr<UIContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<UIContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<UIContext>)sVar1.super___shared_ptr<UIContext,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<UIContext> CreateUIContext(GraphicsContext& gc)
{
    auto ui = std::make_shared<GusteauChapter1UI>(gc, "gusteau", 1024, 1024);
    return ui;
}